

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::Value(Value *this,ValueView *source)

{
  bool bVar1;
  void *source_00;
  size_t size;
  ValueView *source_local;
  Value *this_local;
  
  source_00 = ValueView::getRawData(source);
  size = Type::getValueDataSize(&source->type);
  Value(this,&source->type,source_00,size);
  if ((source->stringDictionary != (StringDictionary *)0x0) &&
     (bVar1 = Type::usesStrings(&(this->value).type), bVar1)) {
    importStringHandles(this,&this->value,source->stringDictionary);
  }
  return;
}

Assistant:

inline Value::Value (const ValueView& source) : Value (source.type, source.getRawData(), source.type.getValueDataSize())
{
    if (source.stringDictionary != nullptr && value.type.usesStrings())
        importStringHandles (value, *source.stringDictionary);
}